

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O0

Vec_Int_t * Saig_ManRetimeInitState(Aig_Man_t *p)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  void *pvVar2;
  int *pArray;
  int *pModel;
  int RetValue;
  int i;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vInit;
  Vec_Int_t *vCiIds;
  int nConfLimit;
  Aig_Man_t *p_local;
  
  pCnf = (Cnf_Dat_t *)0x0;
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    p_local = (Aig_Man_t *)0x0;
  }
  else {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if (iVar1 == 0) {
      __assert_fail("RetValue != l_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x43,"Vec_Int_t *Saig_ManRetimeInitState(Aig_Man_t *)");
    }
    if (iVar1 == 1) {
      iVar1 = Aig_ManCiNum(p);
      p_01 = Vec_IntAlloc(iVar1);
      for (pModel._4_4_ = 0; iVar1 = Vec_PtrSize(p->vCis), pModel._4_4_ < iVar1;
          pModel._4_4_ = pModel._4_4_ + 1) {
        pvVar2 = Vec_PtrEntry(p->vCis,pModel._4_4_);
        Vec_IntPush(p_01,p_00->pVarNums[*(int *)((long)pvVar2 + 0x24)]);
      }
      pArray = Sat_SolverGetModel(s,p_01->pArray,p_01->nSize);
      iVar1 = Aig_ManCiNum(p);
      pCnf = (Cnf_Dat_t *)Vec_IntAllocArray(pArray,iVar1);
      Vec_IntFree(p_01);
    }
    sat_solver_delete(s);
    Cnf_DataFree(p_00);
    p_local = (Aig_Man_t *)pCnf;
  }
  return (Vec_Int_t *)p_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives the initial state after backward retiming.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManRetimeInitState( Aig_Man_t * p )
{
    int nConfLimit = 1000000;
    Vec_Int_t * vCiIds, * vInit = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i, RetValue, * pModel;
    // solve the SAT problem
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    // create counter-example
    if ( RetValue == l_True )
    {
        // accumulate SAT variables of the CIs
        vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
        // create the model
        pModel = Sat_SolverGetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        vInit = Vec_IntAllocArray( pModel, Aig_ManCiNum(p) );
        Vec_IntFree( vCiIds );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return vInit;
}